

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O2

int ply_close(p_ply ply)

{
  size_t sVar1;
  long lVar2;
  long lVar3;
  
  if ((ply == (p_ply)0x0) || ((FILE *)ply->fp == (FILE *)0x0)) {
    __assert_fail("ply && ply->fp",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                  ,0x2b8,"int ply_close(p_ply)");
  }
  if (ply->element == (p_ply_element)0x0) {
    if (ply->nelements != 0) {
      __assert_fail("ply->element || ply->nelements == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                    ,0x2b9,"int ply_close(p_ply)");
    }
  }
  else if (ply->nelements < 1) {
    __assert_fail("!ply->element || ply->nelements > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                  ,0x2ba,"int ply_close(p_ply)");
  }
  if ((ply->io_mode == PLY_WRITE) &&
     (sVar1 = fwrite(ply->buffer,1,ply->buffer_last,(FILE *)ply->fp), sVar1 < ply->buffer_last)) {
    ply_ferror(ply,"Error closing up");
    return 0;
  }
  if (ply->own_fp != 0) {
    fclose((FILE *)ply->fp);
  }
  if (ply->element != (p_ply_element)0x0) {
    lVar2 = 0x108;
    for (lVar3 = 0; lVar3 < ply->nelements; lVar3 = lVar3 + 1) {
      free(*(void **)(ply->element->name + lVar2));
      lVar2 = lVar2 + 0x118;
    }
    free(ply->element);
  }
  free(ply->obj_info);
  free(ply->comment);
  free(ply);
  return 1;
}

Assistant:

int ply_close(p_ply ply) {
    long i;
    assert(ply && ply->fp);
    assert(ply->element || ply->nelements == 0);
    assert(!ply->element || ply->nelements > 0);
    /* write last chunk to file */
    if (ply->io_mode == PLY_WRITE &&
      fwrite(ply->buffer, 1, ply->buffer_last, ply->fp) < ply->buffer_last) {
        ply_ferror(ply, "Error closing up");
        return 0;
    }
    if (ply->own_fp) fclose(ply->fp);
    /* free all memory used by handle */
    if (ply->element) {
        for (i = 0; i < ply->nelements; i++) {
            p_ply_element element = &ply->element[i];
            if (element->property) free(element->property);
        }
        free(ply->element);
    }
    if (ply->obj_info) free(ply->obj_info);
    if (ply->comment) free(ply->comment);
    free(ply);
    return 1;
}